

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001a9340 = 0x2e2e2e2e2e2e2e;
    uRam00000000001a9347._0_1_ = '.';
    uRam00000000001a9347._1_1_ = '.';
    uRam00000000001a9347._2_1_ = '.';
    uRam00000000001a9347._3_1_ = '.';
    uRam00000000001a9347._4_1_ = '.';
    uRam00000000001a9347._5_1_ = '.';
    uRam00000000001a9347._6_1_ = '.';
    uRam00000000001a9347._7_1_ = '.';
    DAT_001a9330 = '.';
    DAT_001a9330_1._0_1_ = '.';
    DAT_001a9330_1._1_1_ = '.';
    DAT_001a9330_1._2_1_ = '.';
    DAT_001a9330_1._3_1_ = '.';
    DAT_001a9330_1._4_1_ = '.';
    DAT_001a9330_1._5_1_ = '.';
    DAT_001a9330_1._6_1_ = '.';
    uRam00000000001a9338 = 0x2e2e2e2e2e2e2e;
    DAT_001a933f = 0x2e;
    DAT_001a9320 = '.';
    DAT_001a9320_1._0_1_ = '.';
    DAT_001a9320_1._1_1_ = '.';
    DAT_001a9320_1._2_1_ = '.';
    DAT_001a9320_1._3_1_ = '.';
    DAT_001a9320_1._4_1_ = '.';
    DAT_001a9320_1._5_1_ = '.';
    DAT_001a9320_1._6_1_ = '.';
    uRam00000000001a9328._0_1_ = '.';
    uRam00000000001a9328._1_1_ = '.';
    uRam00000000001a9328._2_1_ = '.';
    uRam00000000001a9328._3_1_ = '.';
    uRam00000000001a9328._4_1_ = '.';
    uRam00000000001a9328._5_1_ = '.';
    uRam00000000001a9328._6_1_ = '.';
    uRam00000000001a9328._7_1_ = '.';
    DAT_001a9310 = '.';
    DAT_001a9310_1._0_1_ = '.';
    DAT_001a9310_1._1_1_ = '.';
    DAT_001a9310_1._2_1_ = '.';
    DAT_001a9310_1._3_1_ = '.';
    DAT_001a9310_1._4_1_ = '.';
    DAT_001a9310_1._5_1_ = '.';
    DAT_001a9310_1._6_1_ = '.';
    uRam00000000001a9318._0_1_ = '.';
    uRam00000000001a9318._1_1_ = '.';
    uRam00000000001a9318._2_1_ = '.';
    uRam00000000001a9318._3_1_ = '.';
    uRam00000000001a9318._4_1_ = '.';
    uRam00000000001a9318._5_1_ = '.';
    uRam00000000001a9318._6_1_ = '.';
    uRam00000000001a9318._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000001a9308._0_1_ = '.';
    uRam00000000001a9308._1_1_ = '.';
    uRam00000000001a9308._2_1_ = '.';
    uRam00000000001a9308._3_1_ = '.';
    uRam00000000001a9308._4_1_ = '.';
    uRam00000000001a9308._5_1_ = '.';
    uRam00000000001a9308._6_1_ = '.';
    uRam00000000001a9308._7_1_ = '.';
    DAT_001a934f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}